

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitPaired(SplitToolPrivate *this)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  _Base_ptr this_00;
  ostream *poVar4;
  undefined1 *__rhs;
  bool isCurrentAlignmentPaired;
  RefVector *local_218;
  string *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  BamReader *local_200;
  string outputFilename;
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  outputFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  BamAlignment al;
  
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outputFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  BamAlignment::BamAlignment(&al);
  local_200 = &this->m_reader;
  local_208 = &this->m_outputFilenameStub;
  local_210 = &this->m_header;
  local_218 = &this->m_references;
LAB_0012a193:
  bVar1 = BamReader::GetNextAlignment(local_200,&al);
  if (bVar1) {
    isCurrentAlignmentPaired = BamAlignment::IsPaired(&al);
    iVar3 = std::
            _Rb_tree<bool,_std::pair<const_bool,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_bool,_BamTools::BamWriter_*>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
            ::find(&outputFiles._M_t,&isCurrentAlignmentPaired);
    if ((_Rb_tree_header *)iVar3._M_node != &outputFiles._M_t._M_impl.super__Rb_tree_header)
    goto code_r0x0012a1d0;
    __rhs = SPLIT_SINGLE_TOKEN_abi_cxx11_;
    if (isCurrentAlignmentPaired != false) {
      __rhs = SPLIT_PAIRED_TOKEN_abi_cxx11_;
    }
    std::operator+(&local_1a8,local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&outputFilename,&local_1a8,".bam");
    std::__cxx11::string::~string((string *)&local_1a8);
    this_00 = (_Base_ptr)operator_new(8);
    BamWriter::BamWriter((BamWriter *)this_00);
    bVar2 = BamWriter::Open((BamWriter *)this_00,&outputFilename,local_210,local_218);
    if (bVar2) {
      local_1a8._M_dataplus._M_p._0_1_ = isCurrentAlignmentPaired;
      local_1a8._M_string_length = (size_type)this_00;
      std::
      _Rb_tree<bool,std::pair<bool_const,BamTools::BamWriter*>,std::_Select1st<std::pair<bool_const,BamTools::BamWriter*>>,std::less<bool>,std::allocator<std::pair<bool_const,BamTools::BamWriter*>>>
      ::_M_emplace_unique<std::pair<bool,BamTools::BamWriter*>>
                ((_Rb_tree<bool,std::pair<bool_const,BamTools::BamWriter*>,std::_Select1st<std::pair<bool_const,BamTools::BamWriter*>>,std::less<bool>,std::allocator<std::pair<bool_const,BamTools::BamWriter*>>>
                  *)&outputFiles,(pair<bool,_BamTools::BamWriter_*> *)&local_1a8);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"bamtool split ERROR: could not open ");
      poVar4 = std::operator<<(poVar4,(string *)&outputFilename);
      poVar4 = std::operator<<(poVar4," for writing.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&outputFilename);
    if (bVar2) goto LAB_0012a2be;
  }
  else {
    CloseWriters<bool>(this,&outputFiles);
  }
  BamAlignment::~BamAlignment(&al);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_bool,_BamTools::BamWriter_*>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::~_Rb_tree(&outputFiles._M_t);
  return !bVar1;
code_r0x0012a1d0:
  this_00 = iVar3._M_node[1]._M_parent;
  if (this_00 != (_Base_ptr)0x0) {
LAB_0012a2be:
    BamWriter::SaveAlignment((BamWriter *)this_00,&al);
  }
  goto LAB_0012a193;
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitPaired()
{

    // set up splitting data structure
    std::map<bool, BamWriter*> outputFiles;
    std::map<bool, BamWriter*>::iterator writerIter;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    bool isCurrentAlignmentPaired;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        isCurrentAlignmentPaired = al.IsPaired();
        writerIter = outputFiles.find(isCurrentAlignmentPaired);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // open new BamWriter
            const std::string outputFilename =
                m_outputFilenameStub +
                (isCurrentAlignmentPaired ? SPLIT_PAIRED_TOKEN : SPLIT_SINGLE_TOKEN) + ".bam";
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtool split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(isCurrentAlignmentPaired, writer));
        }

        // else grab corresponding writer
        else {
            writer = (*writerIter).second;
        }

        // store alignment in proper BAM output file
        if (writer) {
            writer->SaveAlignment(al);
        }
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}